

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

QString * __thiscall QWidgetLineControl::clearString(QWidgetLineControl *this,int pos,int len)

{
  int iVar1;
  int *piVar2;
  type pMVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int i;
  int end;
  QString *s;
  size_t in_stack_ffffffffffffffa8;
  QString *pQVar4;
  int local_34;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX < *(int *)(in_RSI + 0x60)) {
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = in_RDI;
    QString::QString((QString *)0x5deab6);
    local_c = in_EDX + in_ECX;
    piVar2 = qMin<int>((int *)(in_RSI + 0x60),&local_c);
    iVar1 = *piVar2;
    for (local_34 = in_EDX; local_34 < iVar1; local_34 = local_34 + 1) {
      pMVar3 = std::
               unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
               ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                             *)in_RDI,in_stack_ffffffffffffffa8);
      if ((pMVar3->separator & 1U) == 0) {
        QString::operator+=(in_RDI,(QChar)(char16_t)((ulong)pQVar4 >> 0x30));
      }
      else {
        std::
        unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
        ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                      *)in_RDI,in_stack_ffffffffffffffa8);
        QString::operator+=(in_RDI,(QChar)(char16_t)((ulong)pQVar4 >> 0x30));
      }
    }
  }
  else {
    QString::QString((QString *)0x5dea82);
    pQVar4 = in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QString QWidgetLineControl::clearString(int pos, int len) const
{
    if (pos >= m_maxLength)
        return QString();

    QString s;
    int end = qMin(m_maxLength, pos + len);
    for (int i = pos; i < end; ++i)
        if (m_maskData[i].separator)
            s += m_maskData[i].maskChar;
        else
            s += m_blank;

    return s;
}